

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O2

_Bool borg_one_step_wearing_best(int skip)

{
  borg_best *pbVar1;
  uint8_t uVar2;
  borg_item_conflict *pbVar3;
  keycode_t k;
  angband_constants *paVar4;
  borg_best *pbVar5;
  _Bool _Var6;
  uint16_t uVar7;
  int iVar8;
  int n;
  int16_t *piVar9;
  long lVar10;
  ulong uVar11;
  char *what;
  bool bVar12;
  
  bVar12 = skip == 0;
  do {
    while( true ) {
      paVar4 = z_info;
      iVar8 = 0;
      if (borg.goal.best_item == (borg_best *)0x0) goto LAB_0021c784;
      do {
        while( true ) {
          n = iVar8;
          pbVar1 = borg.goal.best_item + n;
          uVar2 = borg.goal.best_item[n].tval;
          if (((uVar2 != '\0') || (pbVar1->pval != 0)) || (pbVar1->sval != '\0')) break;
          iVar8 = n + 1;
          if ((int)(uint)z_info->equip_slots_max <= n + 1) {
            borg_clear_best();
            if (bVar12) {
              borg.goal.do_best = false;
            }
            goto LAB_0021c782;
          }
        }
        iVar8 = n + 1;
      } while (!bVar12);
      uVar7 = borg_best_stuff_order(n);
      if (pbVar1->home != true) break;
      bVar12 = false;
      if (borg_items[uVar7].iqty == '\0') {
        _Var6 = borg_inventory_full();
        if (!_Var6) {
          lVar10 = 100;
          uVar11 = 0;
          goto LAB_0021c698;
        }
      }
      else {
        _Var6 = borg_home_full();
        if (!_Var6) {
          borg_keypress(100);
          k = 0x2f;
          goto LAB_0021c74a;
        }
      }
    }
    if (borg_items[uVar7].iqty == '\0') {
      piVar9 = &borg_items->pval;
      lVar10 = 0;
      goto LAB_0021c70d;
    }
    bVar12 = false;
    _Var6 = borg_inventory_full();
  } while (_Var6);
  k = 0x74;
LAB_0021c74a:
  borg_keypress(k);
  borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                     [(ulong)uVar7 - (ulong)z_info->pack_size]);
LAB_0021c772:
  iVar8 = 1;
  goto LAB_0021c784;
LAB_0021c70d:
  if ((ulong)paVar4->pack_size + 0xc == lVar10) goto LAB_0021c737;
  if (((*piVar9 == pbVar1->pval) && (*(uint8_t *)(piVar9 + -1) == uVar2)) &&
     (*(uint8_t *)((long)piVar9 + -1) == pbVar1->sval)) {
    borg_keypress(0x77);
    borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[lVar10]);
    pbVar5 = borg.goal.best_item;
    pbVar1 = borg.goal.best_item + n;
    pbVar1->home = false;
    pbVar1->tval = '\0';
    pbVar5[n].pval = 0;
    pbVar5[n].sval = '\0';
    goto LAB_0021c772;
  }
  lVar10 = lVar10 + 1;
  piVar9 = piVar9 + 0x1c4;
  goto LAB_0021c70d;
LAB_0021c737:
  what = "unable to find item in inventory";
  goto LAB_0021c77d;
LAB_0021c698:
  if (z_info->store_inven_max == uVar11) goto LAB_0021c776;
  pbVar3 = borg_shops[7].ware;
  if (((*(short *)(pbVar3->desc + lVar10 + -2) == borg.goal.best_item[n].pval) &&
      (pbVar3->desc[lVar10 + -4] == borg.goal.best_item[n].tval)) &&
     (pbVar3->desc[lVar10 + -3] == borg.goal.best_item[n].sval)) {
    borg_keypress((int)SHOP_MENU_ITEMS[uVar11]);
    borg_keypress(0x70);
    if (1 < (byte)pbVar3->desc[lVar10]) {
      borg_keypress(0x9c);
    }
    borg.goal.best_item[n].home = false;
    goto LAB_0021c772;
  }
  uVar11 = uVar11 + 1;
  lVar10 = lVar10 + 0x388;
  goto LAB_0021c698;
LAB_0021c776:
  what = "unable to find item in home";
LAB_0021c77d:
  borg_oops(what);
LAB_0021c782:
  iVar8 = 0;
LAB_0021c784:
  return SUB41(iVar8,0);
}

Assistant:

static bool borg_one_step_wearing_best(int skip)
{
    borg_item *item;
    int        item_num = 0;
    int        slot;
    int        i;

    if (!borg.goal.best_item)
        return false;

    /* find a change */
    while (true) {
        /* skip some if there are issues with full inventory */
        int skipping = skip;
        if (borg.goal.best_item[item_num].tval
            || borg.goal.best_item[item_num].pval
            || borg.goal.best_item[item_num].sval) {
            if (skipping) {
                item_num++;
                skipping--;
                continue;
            }

            break;
        }

        item_num++;
        if (item_num >= z_info->equip_slots_max) {
            borg_clear_best();

            /* If we aren't skipping we have done our best optimization.  */
            /* if we are skipping and got to the end, we probably need */
            /*  to start over */
            if (!skip) {
                borg.goal.do_best = false;
            }

            return false;
        }
    }

    /* Extract the slot */
    slot = borg_best_stuff_order(item_num);

    /* if the item is a home item to be worn, */
    /*  * drop any item you already have in the slot */
    /*  * if the slot is empty, pick up the item and mark */
    /*    as not in the home */
    /* if the item is not a home item to be worn, */
    /*      it is an inventory item.  */
    /*  * take off any item you already have in the slot */
    /*  * if the slot is empty, wear the item */
    /* NOTE that items need to be found again because they could have */
    /*   moved slots since other objects are being taken off and dropped */
    /*   into inventory and the home*/
    if (borg.goal.best_item[item_num].home) {
        /* if wearing an item in that slot, drop it */
        if (borg_items[slot].iqty) {

            /* if we can't drop an item into the home try the next change */
            if (borg_home_full())
                return borg_one_step_wearing_best(skip+1);


            borg_keypress('d');
            borg_keypress('/');
            borg_keypress(all_letters_nohjkl[slot - INVEN_WIELD]);
            return true;
        }

        /* if we can't get an item from the home, try the next change */
        if (borg_inventory_full())
            return borg_one_step_wearing_best(skip + 1);

        for (i = 0; i < z_info->store_inven_max; i++) {
            item = &borg_shops[BORG_HOME].ware[i];

            if (item->pval != borg.goal.best_item[item_num].pval
                || item->tval != borg.goal.best_item[item_num].tval
                || item->sval != borg.goal.best_item[item_num].sval)
                continue;

            /* "Buy" the desired item from the home */
            borg_keypress(SHOP_MENU_ITEMS[i]);
            borg_keypress('p');
            if (item->iqty > 1)
                borg_keypress(KC_ENTER);


            borg.goal.best_item[item_num].home = false;
            return true;
        }
        borg_oops("unable to find item in home");
    } else {
        /* if wearing an item in that slot, take it off */
        if (borg_items[slot].iqty) {
            /* take off an item because there is no room, try next */
            if (borg_inventory_full())
                return borg_one_step_wearing_best(skip + 1);

            borg_keypress('t');
            borg_keypress(all_letters_nohjkl[slot - INVEN_WIELD]);
            return true;
        }
        for (i = 0; i < INVEN_TOTAL; i++) {
            item = &borg_items[i];

            if (item->pval != borg.goal.best_item[item_num].pval
                || item->tval != borg.goal.best_item[item_num].tval
                || item->sval != borg.goal.best_item[item_num].sval)
                continue;
            borg_keypress('w');
            borg_keypress(all_letters_nohjkl[i]);

            borg.goal.best_item[item_num].home = false;
            borg.goal.best_item[item_num].tval = 0;
            borg.goal.best_item[item_num].pval = 0;
            borg.goal.best_item[item_num].sval = 0;
            return true;
        }
        borg_oops("unable to find item in inventory");
    }

    return false;
}